

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

ObjNative * newNative(NativeFn function)

{
  ObjNative *pOVar1;
  
  pOVar1 = (ObjNative *)reallocate((void *)0x0,0,0x18);
  (pOVar1->obj).type = OBJ_NATIVE;
  (pOVar1->obj).next = vm.objects;
  (pOVar1->obj).isMarked = false;
  vm.objects = (Obj *)pOVar1;
  pOVar1->function = function;
  return pOVar1;
}

Assistant:

ObjNative *newNative(NativeFn function) {
    ObjNative *native = ALLOCATE_OBJ(ObjNative, OBJ_NATIVE);
    native->function = function;
    return native;
}